

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint16_t *puVar7;
  BrotliDictionary *pBVar8;
  undefined8 uVar9;
  int iVar10;
  bool bVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  uint32_t uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint8_t *puVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int last_distance;
  ulong uVar26;
  uint8_t *puVar27;
  ulong uVar28;
  bool bVar29;
  long lVar30;
  int *piVar31;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  ulong uVar47;
  ulong uVar48;
  ulong local_150;
  ulong local_140;
  ulong local_120;
  ulong local_f8;
  int local_e4;
  Command *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_78;
  HasherCommon *common;
  
  iVar13 = params->lgwin;
  uVar35 = *last_insert_len;
  uVar1 = position + num_bytes;
  uVar4 = (position - 3) + num_bytes;
  sVar32 = position;
  if (3 < num_bytes) {
    sVar32 = uVar4;
  }
  lVar33 = 0x200;
  if (params->quality < 9) {
    lVar33 = 0x40;
  }
  uVar39 = *(uint *)(hasher + 0x10);
  if (4 < (int)uVar39) {
    iVar14 = *dist_cache;
    dist_cache[4] = iVar14 + -1;
    dist_cache[5] = iVar14 + 1;
    dist_cache[6] = iVar14 + -2;
    dist_cache[7] = iVar14 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar14 + 3,iVar14 + -3);
    if (10 < uVar39) {
      iVar14 = dist_cache[1];
      dist_cache[10] = iVar14 + -1;
      dist_cache[0xb] = iVar14 + 1;
      dist_cache[0xc] = iVar14 + -2;
      dist_cache[0xd] = iVar14 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar14 + 3,iVar14 + -3);
    }
  }
  if (position + 4 < uVar1) {
    uVar5 = (1L << ((byte)iVar13 & 0x3f)) - 0x10;
    local_120 = lVar33 + position;
    lVar3 = position - 1;
    local_c8 = commands;
    sVar46 = position;
    do {
      uVar23 = uVar1 - sVar46;
      uVar36 = uVar5;
      if (sVar46 < uVar5) {
        uVar36 = sVar46;
      }
      uVar28 = (params->dist).max_distance;
      uVar26 = sVar46 & ringbuffer_mask;
      if ((long)*(int *)(hasher + 0x10) == 0) {
        local_f8 = 0x7e4;
        local_c0 = 0;
        local_140 = 0;
        uVar48 = 0;
      }
      else {
        puVar27 = ringbuffer + uVar26;
        uVar17 = (ulong)((uint)uVar23 & 7);
        local_f8 = 0x7e4;
        uVar48 = 0;
        uVar34 = 0;
        local_140 = 0;
        local_c0 = 0;
        do {
          uVar45 = (ulong)dist_cache[uVar34];
          if (((uVar45 <= uVar36) && (sVar46 - uVar45 < sVar46)) &&
             (uVar48 + uVar26 <= ringbuffer_mask)) {
            uVar24 = sVar46 - uVar45 & ringbuffer_mask;
            if ((uVar24 + uVar48 <= ringbuffer_mask) &&
               (ringbuffer[uVar48 + uVar26] == ringbuffer[uVar24 + uVar48])) {
              if (7 < uVar23) {
                lVar18 = 0;
                uVar41 = 0;
LAB_001040be:
                if (*(ulong *)(puVar27 + uVar41 * 8) == *(ulong *)(ringbuffer + uVar41 * 8 + uVar24)
                   ) goto code_r0x001040cb;
                uVar41 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar24) ^
                         *(ulong *)(puVar27 + uVar41 * 8);
                uVar24 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                uVar41 = (uVar24 >> 3 & 0x1fffffff) - lVar18;
                goto LAB_00104108;
              }
              puVar19 = puVar27;
              uVar42 = 0;
LAB_0010417c:
              uVar41 = uVar42;
              if (uVar17 != 0) {
                uVar44 = uVar17 | uVar42;
                uVar47 = uVar17;
                do {
                  uVar41 = uVar42;
                  if (ringbuffer[uVar42 + uVar24] != *puVar19) break;
                  puVar19 = puVar19 + 1;
                  uVar42 = uVar42 + 1;
                  uVar47 = uVar47 - 1;
                  uVar41 = uVar44;
                } while (uVar47 != 0);
              }
LAB_00104108:
              if (((2 < uVar41) || ((uVar34 < 2 && (uVar41 == 2)))) &&
                 (uVar24 = uVar41 * 0x87 + 0x78f, local_f8 < uVar24)) {
                if (uVar34 != 0) {
                  uVar24 = uVar24 - ((0x1ca10U >> ((byte)uVar34 & 0xe) & 0xe) + 0x27);
                }
                if (local_f8 < uVar24) {
                  uVar48 = uVar41;
                  local_c0 = uVar45;
                  local_140 = uVar41;
                  local_f8 = uVar24;
                }
              }
            }
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != (long)*(int *)(hasher + 0x10));
      }
      uVar39 = (uint)(*(int *)(ringbuffer + uVar26) * 0x1e35a7bd) >> (hasher[0x38] & 0x1f);
      lVar18 = *(long *)(hasher + 0x28) * 2 + 0x40;
      piVar2 = (int *)(ringbuffer + uVar26);
      lVar38 = (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 + lVar18;
      uVar6 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
      uVar45 = (ulong)uVar6;
      uVar17 = *(ulong *)(hasher + 0x30);
      uVar34 = 0;
      if (uVar17 <= uVar45) {
        uVar34 = uVar45 - uVar17;
      }
      if (uVar34 < uVar45) {
        uVar24 = (ulong)((uint)uVar23 & 7);
        do {
          uVar45 = uVar45 - 1;
          uVar41 = sVar46 - *(uint *)(hasher + (ulong)((uint)uVar45 & *(uint *)(hasher + 0x3c)) * 4
                                               + lVar38);
          if (uVar36 < uVar41) break;
          if (uVar48 + uVar26 <= ringbuffer_mask) {
            uVar42 = (ulong)(*(uint *)(hasher + (ulong)((uint)uVar45 & *(uint *)(hasher + 0x3c)) * 4
                                                + lVar38) & (uint)ringbuffer_mask);
            if ((uVar48 + uVar42 <= ringbuffer_mask) &&
               (ringbuffer[uVar48 + uVar26] == ringbuffer[uVar48 + uVar42])) {
              if (7 < uVar23) {
                lVar30 = 0;
                uVar47 = 0;
LAB_001042d3:
                if (*(ulong *)(piVar2 + uVar47 * 2) == *(ulong *)(ringbuffer + uVar47 * 8 + uVar42))
                goto code_r0x001042e6;
                uVar47 = *(ulong *)(ringbuffer + uVar47 * 8 + uVar42) ^
                         *(ulong *)(piVar2 + uVar47 * 2);
                uVar42 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar47 = (uVar42 >> 3 & 0x1fffffff) - lVar30;
                goto LAB_0010430d;
              }
              uVar44 = 0;
              piVar31 = piVar2;
LAB_00104358:
              uVar47 = uVar44;
              if (uVar24 != 0) {
                uVar43 = uVar24 | uVar44;
                uVar25 = uVar24;
                do {
                  uVar47 = uVar44;
                  if (ringbuffer[uVar44 + uVar42] != (uint8_t)*piVar31) break;
                  piVar31 = (int *)((long)piVar31 + 1);
                  uVar44 = uVar44 + 1;
                  uVar25 = uVar25 - 1;
                  uVar47 = uVar43;
                } while (uVar25 != 0);
              }
LAB_0010430d:
              if (3 < uVar47) {
                iVar13 = 0x1f;
                if ((uint)uVar41 != 0) {
                  for (; (uint)uVar41 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                uVar42 = (ulong)(iVar13 * -0x1e + 0x780) + uVar47 * 0x87;
                if (local_f8 < uVar42) {
                  uVar48 = uVar47;
                  local_c0 = uVar41;
                  local_140 = uVar47;
                  local_f8 = uVar42;
                }
              }
            }
          }
        } while (uVar34 < uVar45);
      }
      *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar6) * 4 + lVar38) = (int)sVar46;
      *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar6 + 1;
      if (local_f8 == 0x7e4) {
        uVar26 = *(ulong *)(hasher + 0x18);
        local_150 = *(ulong *)(hasher + 0x20);
        if (uVar26 >> 7 <= local_150) {
          uVar48 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar7 = (params->dictionary).hash_table;
          local_f8 = 0x7e4;
          local_e4 = 0;
          bVar29 = true;
LAB_00104422:
          uVar6 = puVar7[uVar48];
          uVar26 = uVar26 + 1;
          *(ulong *)(hasher + 0x18) = uVar26;
          if ((ulong)uVar6 != 0) {
            uVar39 = uVar6 & 0x1f;
            uVar34 = (ulong)uVar39;
            if (uVar23 < uVar34) goto LAB_0010457f;
            pBVar8 = (params->dictionary).words;
            puVar27 = pBVar8->data +
                      (ulong)pBVar8->offsets_by_length[uVar34] + uVar34 * (uVar6 >> 5);
            if (7 < uVar34) {
              local_b8 = (ulong)(uVar6 & 0x18);
              lVar38 = 0;
              uVar45 = 0;
LAB_00104499:
              if (*(ulong *)(puVar27 + uVar45 * 8) == *(ulong *)(piVar2 + uVar45 * 2))
              goto code_r0x001044ab;
              uVar24 = *(ulong *)(piVar2 + uVar45 * 2) ^ *(ulong *)(puVar27 + uVar45 * 8);
              uVar45 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              uVar45 = (uVar45 >> 3 & 0x1fffffff) - lVar38;
              goto LAB_001044e9;
            }
            local_b8 = 0;
            goto LAB_001045c9;
          }
          goto LAB_0010457f;
        }
LAB_00104d2d:
        uVar35 = uVar35 + 1;
        position = sVar46 + 1;
        if (local_120 < position) {
          if ((uint)((int)lVar33 * 4) + local_120 < position) {
            uVar36 = sVar46 + 0x11;
            if (uVar1 - 4 <= sVar46 + 0x11) {
              uVar36 = uVar1 - 4;
            }
            for (; position < uVar36; position = position + 4) {
              uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       (hasher[0x38] & 0x1f);
              uVar6 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
              *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                                (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar6) * 4 + lVar18) =
                   (int)position;
              *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar6 + 1;
              uVar35 = uVar35 + 4;
            }
          }
          else {
            uVar36 = sVar46 + 9;
            if (uVar4 <= sVar46 + 9) {
              uVar36 = uVar4;
            }
            for (; position < uVar36; position = position + 2) {
              uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       (hasher[0x38] & 0x1f);
              uVar6 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
              *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                                (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar6) * 4 + lVar18) =
                   (int)position;
              *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar6 + 1;
              uVar35 = uVar35 + 2;
            }
          }
        }
      }
      else {
        local_e4 = 0;
LAB_00104633:
        if (local_f8 < 0x7e5) goto LAB_00104d2d;
        uVar48 = (lVar3 + num_bytes) - sVar46;
        iVar13 = 0;
        uVar36 = local_140;
        uVar26 = uVar35;
        do {
          uVar23 = uVar23 - 1;
          uVar34 = uVar36 - 1;
          if (uVar23 <= uVar36 - 1) {
            uVar34 = uVar23;
          }
          if (4 < params->quality) {
            uVar34 = 0;
          }
          uVar45 = sVar46 + 1;
          local_140 = uVar5;
          if (uVar45 < uVar5) {
            local_140 = uVar45;
          }
          uVar24 = uVar45 & ringbuffer_mask;
          if ((long)*(int *)(hasher + 0x10) != 0) {
            puVar27 = ringbuffer + uVar24;
            uVar42 = (ulong)((uint)uVar23 & 7);
            uVar41 = 0x7e4;
            uVar47 = 0;
            local_150 = 0;
            local_120 = 0;
LAB_00104718:
            uVar44 = (ulong)dist_cache[uVar47];
            if (((uVar44 <= local_140) && (uVar45 - uVar44 < uVar45)) &&
               (uVar24 + uVar34 <= ringbuffer_mask)) {
              uVar25 = uVar45 - uVar44 & ringbuffer_mask;
              if ((ringbuffer_mask < uVar25 + uVar34) ||
                 (ringbuffer[uVar24 + uVar34] != ringbuffer[uVar25 + uVar34])) goto LAB_00104799;
              uVar43 = uVar42;
              if (7 < uVar23) {
                lVar38 = 0;
                uVar20 = 0;
LAB_00104765:
                if (*(ulong *)(puVar27 + uVar20 * 8) == *(ulong *)(ringbuffer + uVar20 * 8 + uVar25)
                   ) goto code_r0x00104772;
                uVar43 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar25) ^
                         *(ulong *)(puVar27 + uVar20 * 8);
                uVar25 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar20 = (uVar25 >> 3 & 0x1fffffff) - lVar38;
                goto LAB_001047b7;
              }
              uVar20 = 0;
              puVar19 = puVar27;
              goto joined_r0x0010482b;
            }
            goto LAB_00104799;
          }
          uVar41 = 0x7e4;
          local_120 = 0;
          local_150 = 0;
LAB_00104865:
          uVar39 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> (hasher[0x38] & 0x1f);
          piVar2 = (int *)(ringbuffer + uVar24);
          lVar38 = (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 + lVar18;
          uVar6 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
          uVar47 = (ulong)uVar6;
          uVar42 = 0;
          if (uVar17 <= uVar47) {
            uVar42 = uVar47 - uVar17;
          }
          if (uVar42 < uVar47) {
            uVar44 = (ulong)((uint)uVar23 & 7);
LAB_001048d1:
            uVar47 = uVar47 - 1;
            uVar25 = uVar45 - *(uint *)(hasher + (ulong)((uint)uVar47 & *(uint *)(hasher + 0x3c)) *
                                                 4 + lVar38);
            if (uVar25 <= local_140) {
              if (uVar24 + uVar34 <= ringbuffer_mask) {
                uVar43 = (ulong)(*(uint *)(hasher + (ulong)((uint)uVar47 & *(uint *)(hasher + 0x3c))
                                                    * 4 + lVar38) & (uint)ringbuffer_mask);
                if ((ringbuffer_mask < uVar43 + uVar34) ||
                   (ringbuffer[uVar24 + uVar34] != ringbuffer[uVar43 + uVar34])) goto LAB_00104953;
                uVar20 = uVar44;
                if (7 < uVar23) {
                  lVar30 = 0;
                  uVar21 = 0;
LAB_00104927:
                  if (*(ulong *)(piVar2 + uVar21 * 2) ==
                      *(ulong *)(ringbuffer + uVar21 * 8 + uVar43)) goto code_r0x00104934;
                  uVar20 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar43) ^
                           *(ulong *)(piVar2 + uVar21 * 2);
                  uVar43 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  uVar21 = (uVar43 >> 3 & 0x1fffffff) - lVar30;
                  goto LAB_0010496b;
                }
                uVar21 = 0;
                piVar31 = piVar2;
                goto joined_r0x001049bd;
              }
              goto LAB_00104953;
            }
          }
LAB_001049da:
          *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar6) * 4 + lVar38) =
               (int)uVar45;
          *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar6 + 1;
          if (uVar41 == 0x7e4) {
            uVar34 = *(ulong *)(hasher + 0x18);
            local_78 = *(ulong *)(hasher + 0x20);
            uVar41 = 0x7e4;
            if (uVar34 >> 7 <= local_78) {
              uVar24 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar7 = (params->dictionary).hash_table;
              iVar14 = 0;
              uVar41 = 0x7e4;
              bVar29 = true;
LAB_00104b25:
              uVar6 = puVar7[uVar24];
              uVar34 = uVar34 + 1;
              *(ulong *)(hasher + 0x18) = uVar34;
              if ((ulong)uVar6 != 0) {
                uVar39 = uVar6 & 0x1f;
                uVar42 = (ulong)uVar39;
                if (uVar23 < uVar42) goto LAB_00104c66;
                pBVar8 = (params->dictionary).words;
                puVar27 = pBVar8->data +
                          (ulong)pBVar8->offsets_by_length[uVar42] + uVar42 * (uVar6 >> 5);
                if (7 < uVar42) {
                  uVar47 = (ulong)(uVar6 & 0x18);
                  lVar38 = 0;
                  uVar44 = 0;
LAB_00104ba0:
                  if (*(ulong *)(puVar27 + uVar44 * 8) == *(ulong *)(piVar2 + uVar44 * 2))
                  goto code_r0x00104bb2;
                  uVar44 = *(ulong *)(piVar2 + uVar44 * 2) ^ *(ulong *)(puVar27 + uVar44 * 8);
                  uVar47 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  uVar44 = (uVar47 >> 3 & 0x1fffffff) - lVar38;
                  goto LAB_00104bf2;
                }
                uVar47 = 0;
                goto LAB_00104cef;
              }
              goto LAB_00104c66;
            }
            iVar14 = 0;
          }
          else {
            iVar14 = 0;
          }
LAB_00104a65:
          if (uVar41 < local_f8 + 0xaf) {
            uVar45 = sVar46;
            uVar34 = uVar26;
            local_150 = uVar36;
            iVar14 = local_e4;
            local_140 = uVar5;
            if (sVar46 < uVar5) {
              local_140 = sVar46;
            }
            break;
          }
          local_c0 = local_120;
          uVar34 = uVar35 + 4;
          if (iVar13 == 3) break;
          uVar34 = uVar26 + 1;
          iVar13 = iVar13 + 1;
          uVar24 = sVar46 + 5;
          uVar48 = uVar48 - 1;
          local_f8 = uVar41;
          uVar36 = local_150;
          uVar26 = uVar34;
          sVar46 = uVar45;
          local_e4 = iVar14;
        } while (uVar24 < uVar1);
        iVar13 = (int)local_c0;
        if (local_140 < local_c0) {
LAB_00104e8c:
          uVar35 = local_c0 + 0xf;
LAB_00104e90:
          if ((local_c0 <= local_140) && (uVar35 != 0)) {
            dist_cache[3] = dist_cache[2];
            uVar9 = *(undefined8 *)dist_cache;
            *(undefined8 *)(dist_cache + 1) = uVar9;
            *dist_cache = iVar13;
            uVar39 = *(uint *)(hasher + 0x10);
            if (4 < (int)uVar39) {
              dist_cache[4] = iVar13 + -1;
              dist_cache[5] = iVar13 + 1;
              dist_cache[6] = iVar13 + -2;
              dist_cache[7] = iVar13 + 2;
              dist_cache[8] = iVar13 + -3;
              dist_cache[9] = iVar13 + 3;
              if (10 < uVar39) {
                iVar13 = (int)uVar9;
                dist_cache[10] = iVar13 + -1;
                dist_cache[0xb] = iVar13 + 1;
                dist_cache[0xc] = iVar13 + -2;
                dist_cache[0xd] = iVar13 + 2;
                *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar13 + 3,iVar13 + -3);
              }
            }
          }
        }
        else {
          if (local_c0 != (long)*dist_cache) {
            uVar35 = 1;
            if (local_c0 != (long)dist_cache[1]) {
              uVar35 = (local_c0 + 3) - (long)*dist_cache;
              if (uVar35 < 7) {
                bVar22 = (byte)((int)uVar35 << 2);
                uVar39 = 0x9750468;
              }
              else {
                uVar35 = (local_c0 + 3) - (long)dist_cache[1];
                if (6 < uVar35) {
                  uVar35 = 2;
                  if ((local_c0 != (long)dist_cache[2]) &&
                     (uVar35 = 3, local_c0 != (long)dist_cache[3])) goto LAB_00104e8c;
                  goto LAB_00104e90;
                }
                bVar22 = (byte)((int)uVar35 << 2);
                uVar39 = 0xfdb1ace;
              }
              uVar35 = (ulong)(uVar39 >> (bVar22 & 0x1f) & 0xf);
            }
            goto LAB_00104e90;
          }
          uVar35 = 0;
        }
        uVar39 = (uint)uVar34;
        local_c8->insert_len_ = uVar39;
        local_c8->copy_len_ = iVar14 << 0x19 | (uint)local_150;
        uVar23 = (ulong)(params->dist).num_direct_distance_codes;
        uVar36 = uVar23 + 0x10;
        uVar15 = 0;
        if (uVar36 <= uVar35) {
          uVar40 = (params->dist).distance_postfix_bits;
          bVar22 = (byte)uVar40;
          uVar23 = ((4L << (bVar22 & 0x3f)) + (uVar35 - uVar23)) - 0x10;
          uVar37 = 0x1f;
          uVar16 = (uint)uVar23;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar37 == 0; uVar37 = uVar37 - 1) {
            }
          }
          uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
          uVar28 = (ulong)((uVar23 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
          lVar18 = (ulong)uVar37 - (ulong)uVar40;
          uVar35 = (~(-1 << (bVar22 & 0x1f)) & uVar16) + uVar36 +
                   (uVar28 + lVar18 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar18 * 0x400;
          uVar15 = (uint32_t)(uVar23 - (uVar28 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar22 & 0x3f));
        }
        local_c8->dist_prefix_ = (uint16_t)uVar35;
        local_c8->dist_extra_ = uVar15;
        if (5 < uVar34) {
          if (uVar34 < 0x82) {
            uVar39 = 0x1f;
            uVar40 = (uint)(uVar34 - 2);
            if (uVar40 != 0) {
              for (; uVar40 >> uVar39 == 0; uVar39 = uVar39 - 1) {
              }
            }
            uVar39 = (int)(uVar34 - 2 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar39 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar34 < 0x842) {
            uVar40 = 0x1f;
            if (uVar39 - 0x42 != 0) {
              for (; uVar39 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar39 = (uVar40 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar39 = 0x15;
            if (0x1841 < uVar34) {
              uVar39 = (uint)(ushort)(0x17 - (uVar34 < 0x5842));
            }
          }
        }
        uVar40 = iVar14 + (uint)local_150;
        if (uVar40 < 10) {
          uVar37 = uVar40 - 2;
        }
        else if (uVar40 < 0x86) {
          uVar40 = uVar40 - 6;
          uVar37 = 0x1f;
          if (uVar40 != 0) {
            for (; uVar40 >> uVar37 == 0; uVar37 = uVar37 - 1) {
            }
          }
          uVar37 = (uVar40 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                   (uVar37 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar37 = 0x17;
          if (uVar40 < 0x846) {
            uVar37 = 0x1f;
            if (uVar40 - 0x46 != 0) {
              for (; uVar40 - 0x46 >> uVar37 == 0; uVar37 = uVar37 - 1) {
              }
            }
            uVar37 = (uVar37 ^ 0xffe0) + 0x2c;
          }
        }
        uVar6 = (ushort)uVar37;
        uVar12 = (uVar6 & 7) + ((ushort)uVar39 & 7) * 8;
        if ((((uVar35 & 0x3ff) == 0) && ((ushort)uVar39 < 8)) && (uVar6 < 0x10)) {
          if (7 < uVar6) {
            uVar12 = uVar12 | 0x40;
          }
        }
        else {
          iVar13 = ((uVar39 & 0xffff) >> 3) * 3 + ((uVar37 & 0xffff) >> 3);
          uVar12 = uVar12 + ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar13 * 0x40 + 0x40;
        }
        local_c8->cmd_prefix_ = uVar12;
        *num_literals = *num_literals + uVar34;
        position = uVar45 + local_150;
        uVar35 = sVar32;
        if (position < sVar32) {
          uVar35 = position;
        }
        uVar36 = uVar45 + 2;
        if (local_c0 < local_150 >> 2) {
          uVar23 = position + local_c0 * -4;
          if (uVar23 < uVar36) {
            uVar23 = uVar36;
          }
          uVar36 = uVar23;
          if (uVar35 < uVar23) {
            uVar36 = uVar35;
          }
        }
        local_120 = uVar45 + lVar33 + local_150 * 2;
        local_c8 = local_c8 + 1;
        if (uVar36 < uVar35) {
          lVar18 = *(long *)(hasher + 0x28);
          do {
            uVar39 = (uint)(*(int *)(ringbuffer + (uVar36 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     (hasher[0x38] & 0x1f);
            uVar6 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
            *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                              (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar6) * 4 +
                              lVar18 * 2 + 0x40) = (int)uVar36;
            *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar6 + 1;
            uVar36 = uVar36 + 1;
          } while (uVar35 != uVar36);
        }
        uVar35 = 0;
      }
      sVar46 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_c8 = commands;
  }
  *last_insert_len = (uVar35 + uVar1) - position;
  *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
  return;
code_r0x001040cb:
  uVar41 = uVar41 + 1;
  lVar18 = lVar18 + -8;
  puVar19 = puVar27 + (uVar23 & 0xfffffffffffffff8);
  uVar42 = uVar23 & 0xfffffffffffffff8;
  if (uVar23 >> 3 == uVar41) goto LAB_0010417c;
  goto LAB_001040be;
code_r0x001042e6:
  uVar47 = uVar47 + 1;
  lVar30 = lVar30 + -8;
  uVar44 = uVar23 & 0xfffffffffffffff8;
  piVar31 = (int *)(ringbuffer + (uVar23 & 0xfffffffffffffff8) + uVar26);
  if (uVar23 >> 3 == uVar47) goto LAB_00104358;
  goto LAB_001042d3;
code_r0x001044ab:
  uVar45 = uVar45 + 1;
  lVar38 = lVar38 + -8;
  if (uVar39 >> 3 == uVar45) goto code_r0x001044b7;
  goto LAB_00104499;
code_r0x001044b7:
  puVar27 = puVar27 + -lVar38;
LAB_001045c9:
  uVar24 = (ulong)uVar6 & 7;
  uVar45 = local_b8;
  if ((uVar6 & 7) != 0) {
    uVar41 = local_b8 | uVar24;
    do {
      uVar45 = local_b8;
      if (*(uint8_t *)((long)piVar2 + local_b8) != *puVar27) break;
      puVar27 = puVar27 + 1;
      local_b8 = local_b8 + 1;
      uVar24 = uVar24 - 1;
      uVar45 = uVar41;
    } while (uVar24 != 0);
  }
LAB_001044e9:
  if (((uVar45 != 0) && (uVar34 < (params->dictionary).cutoffTransformsCount + uVar45)) &&
     (uVar34 = (ulong)(uVar6 >> 5) + uVar36 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar34 - uVar45) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar34 - uVar45) * 4 << (pBVar8->size_bits_by_length[uVar34] & 0x3f)),
     uVar34 <= uVar28)) {
    iVar13 = 0x1f;
    if ((uint)uVar34 != 0) {
      for (; (uint)uVar34 >> iVar13 == 0; iVar13 = iVar13 + -1) {
      }
    }
    uVar24 = (uVar45 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
    if (local_f8 <= uVar24) {
      local_e4 = uVar39 - (int)uVar45;
      local_150 = local_150 + 1;
      *(ulong *)(hasher + 0x20) = local_150;
      local_c0 = uVar34;
      local_f8 = uVar24;
      local_140 = uVar45;
    }
  }
LAB_0010457f:
  uVar48 = uVar48 + 1;
  bVar11 = !bVar29;
  bVar29 = false;
  if (bVar11) goto LAB_00104633;
  goto LAB_00104422;
code_r0x00104772:
  uVar20 = uVar20 + 1;
  lVar38 = lVar38 + -8;
  if (uVar48 >> 3 == uVar20) goto code_r0x00104780;
  goto LAB_00104765;
code_r0x00104780:
  uVar20 = -lVar38;
  puVar19 = puVar27 + -lVar38;
joined_r0x0010482b:
  for (; (uVar43 != 0 && (ringbuffer[uVar20 + uVar25] == *puVar19)); uVar20 = uVar20 + 1) {
    puVar19 = puVar19 + 1;
    uVar43 = uVar43 - 1;
  }
LAB_001047b7:
  if (((2 < uVar20) || ((uVar47 < 2 && (uVar20 == 2)))) &&
     (uVar25 = uVar20 * 0x87 + 0x78f, uVar41 < uVar25)) {
    if (uVar47 != 0) {
      uVar25 = uVar25 - ((0x1ca10U >> ((byte)uVar47 & 0xe) & 0xe) + 0x27);
    }
    if (uVar41 < uVar25) {
      uVar34 = uVar20;
      uVar41 = uVar25;
      local_150 = uVar20;
      local_120 = uVar44;
    }
  }
LAB_00104799:
  uVar47 = uVar47 + 1;
  if (uVar47 == (long)*(int *)(hasher + 0x10)) goto LAB_00104865;
  goto LAB_00104718;
code_r0x00104934:
  uVar21 = uVar21 + 1;
  lVar30 = lVar30 + -8;
  if (uVar48 >> 3 == uVar21) goto code_r0x00104942;
  goto LAB_00104927;
code_r0x00104942:
  uVar21 = -lVar30;
  piVar31 = (int *)((long)piVar2 - lVar30);
joined_r0x001049bd:
  for (; (uVar20 != 0 && (ringbuffer[uVar21 + uVar43] == (uint8_t)*piVar31)); uVar21 = uVar21 + 1) {
    uVar20 = uVar20 - 1;
    piVar31 = (int *)((long)piVar31 + 1);
  }
LAB_0010496b:
  if (3 < uVar21) {
    iVar14 = 0x1f;
    if ((uint)uVar25 != 0) {
      for (; (uint)uVar25 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar43 = (ulong)(iVar14 * -0x1e + 0x780) + uVar21 * 0x87;
    if (uVar41 < uVar43) {
      uVar34 = uVar21;
      uVar41 = uVar43;
      local_150 = uVar21;
      local_120 = uVar25;
    }
  }
LAB_00104953:
  if (uVar47 <= uVar42) goto LAB_001049da;
  goto LAB_001048d1;
code_r0x00104bb2:
  uVar44 = uVar44 + 1;
  lVar38 = lVar38 + -8;
  if (uVar39 >> 3 == uVar44) goto code_r0x00104bbe;
  goto LAB_00104ba0;
code_r0x00104bbe:
  puVar27 = puVar27 + -lVar38;
LAB_00104cef:
  uVar25 = (ulong)uVar6 & 7;
  uVar44 = uVar47;
  if ((uVar6 & 7) != 0) {
    uVar43 = uVar47 | uVar25;
    do {
      uVar44 = uVar47;
      if (*(uint8_t *)((long)piVar2 + uVar47) != *puVar27) break;
      puVar27 = puVar27 + 1;
      uVar47 = uVar47 + 1;
      uVar25 = uVar25 - 1;
      uVar44 = uVar43;
    } while (uVar25 != 0);
  }
LAB_00104bf2:
  if (((uVar44 != 0) && (uVar42 < (params->dictionary).cutoffTransformsCount + uVar44)) &&
     (uVar42 = (ulong)(uVar6 >> 5) + local_140 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar42 - uVar44) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar42 - uVar44) * 4 << (pBVar8->size_bits_by_length[uVar42] & 0x3f)),
     uVar42 <= uVar28)) {
    iVar10 = 0x1f;
    if ((uint)uVar42 != 0) {
      for (; (uint)uVar42 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar47 = (uVar44 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
    if (uVar41 <= uVar47) {
      iVar14 = uVar39 - (int)uVar44;
      local_78 = local_78 + 1;
      *(ulong *)(hasher + 0x20) = local_78;
      local_120 = uVar42;
      local_150 = uVar44;
      uVar41 = uVar47;
    }
  }
LAB_00104c66:
  uVar24 = uVar24 + 1;
  bVar11 = !bVar29;
  bVar29 = false;
  if (bVar11) goto LAB_00104a65;
  goto LAB_00104b25;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}